

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void __thiscall
QtPromisePrivate::
PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>::
~PromiseDataBase(PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
                 *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~PromiseDataBase() { }